

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReader.h
# Opt level: O0

void __thiscall FileReader::FileReader(FileReader *this,string *filename)

{
  char *__filename;
  FILE *pFVar1;
  posixerror *this_00;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_20;
  string *filename_local;
  FileReader *this_local;
  
  local_20 = filename;
  filename_local = (string *)this;
  ReadWriter::ReadWriter(&this->super_ReadWriter);
  (this->super_ReadWriter)._vptr_ReadWriter = (_func_int **)&PTR__FileReader_0019af08;
  std::__cxx11::string::string((string *)&this->_filename,local_20);
  this->_state = STATE_FLUSHED;
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar1 = fopen(__filename,"r+b");
  this->_f = (FILE *)pFVar1;
  if (this->_f == (FILE *)0x0) {
    this_00 = (posixerror *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"opening ",&local_71);
    std::operator+(&local_50,&local_70,&this->_filename);
    posixerror::posixerror(this_00,&local_50);
    __cxa_throw(this_00,&posixerror::typeinfo,posixerror::~posixerror);
  }
  return;
}

Assistant:

FileReader(const std::string& filename, readwrite_t)
        : _filename(filename), _state(STATE_FLUSHED)
    {
        _f= fopen(_filename.c_str(), "r+b");
        if (_f==NULL)
            throw posixerror(std::string("opening ")+_filename);
        //printf("readwrite file: %p %s\n", _f, filename.c_str());
    }